

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O1

void ti925t_initfn(uc_struct_conflict1 *uc,CPUState *obj)

{
  byte *pbVar1;
  
  pbVar1 = (byte *)((long)obj[1].tb_jmp_cache + 0x2f99);
  *pbVar1 = *pbVar1 | 0x44;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x646) = 0x54029252;
  *(undefined8 *)((long)obj[1].tb_jmp_cache + 0x323c) = 0x7005109149;
  return;
}

Assistant:

static void ti925t_initfn(struct uc_struct *uc, CPUState *obj)
{
    ARMCPU *cpu = ARM_CPU(obj);
    set_feature(&cpu->env, ARM_FEATURE_V4T);
    set_feature(&cpu->env, ARM_FEATURE_OMAPCP);
    cpu->midr = ARM_CPUID_TI925T;
    cpu->ctr = 0x5109149;
    cpu->reset_sctlr = 0x00000070;
}